

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O0

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  float *pfVar4;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_4;
  Mat m;
  float *ptr_2;
  int q_2;
  int j;
  int i_3;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  int i_2;
  float *ptr_1;
  int i_1;
  float *sptr;
  int p;
  float *ssptr;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  float in_stack_000004b4;
  int in_stack_000004b8;
  int in_stack_000004bc;
  int in_stack_000004c0;
  int in_stack_000004c4;
  Mat *in_stack_000004c8;
  Mat *in_stack_000004d0;
  int in_stack_000004e0;
  Option *in_stack_000004e8;
  Mat *in_stack_fffffffffffffb90;
  int _c;
  undefined4 in_stack_fffffffffffffb98;
  float in_stack_fffffffffffffb9c;
  float in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba4;
  size_type in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  int local_3d0;
  float local_3cc;
  int local_3c0;
  int local_3bc;
  Mat local_3b8;
  Mat local_378;
  float *local_338;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  reference local_318;
  vector<int,_std::allocator<int>_> local_308;
  float local_2f0;
  int local_2ec;
  undefined1 local_2e8 [100];
  int local_284;
  int local_280;
  int local_26c;
  int local_268;
  int local_264;
  Mat local_260;
  float *local_220;
  int local_214;
  Mat local_210;
  float *local_1d0;
  int local_1c4;
  Mat local_1c0;
  float *local_180;
  int local_178;
  float local_174;
  Mat local_170;
  int local_12c;
  Mat local_128;
  float *local_e8;
  Mat local_e0;
  float *local_a0;
  int local_94;
  int local_90;
  Mat local_80;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x34);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_24 * local_28;
  local_20 = in_RDX;
  Mat::Mat(&local_80);
  Mat::create(in_stack_fffffffffffffbb0,(int)(in_stack_fffffffffffffba8 >> 0x20),
              (int)in_stack_fffffffffffffba8,(int)in_stack_fffffffffffffba4,
              CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
              (Allocator *)in_stack_fffffffffffffb90);
  bVar3 = Mat::empty(in_stack_fffffffffffffb90);
  if (bVar3) {
    local_4 = -100;
    local_90 = 1;
    goto LAB_0014a37d;
  }
  for (local_94 = 0; local_94 < local_2c; local_94 = local_94 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_e0);
    Mat::~Mat((Mat *)0x149776);
    local_a0 = pfVar4;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_128);
    Mat::~Mat((Mat *)0x1497c5);
    for (local_12c = 0; local_12c < local_3c; local_12c = local_12c + 1) {
      pfVar4[local_12c] = local_a0[local_12c] * local_a0[local_12c];
    }
    local_e8 = pfVar4;
  }
  if (*(int *)(in_RDI + 0x80) == 0) {
    Mat::Mat(&local_170);
    Mat::create(in_stack_fffffffffffffbb0,(int)(in_stack_fffffffffffffba8 >> 0x20),
                (int)in_stack_fffffffffffffba8,(int)in_stack_fffffffffffffba4,
                CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                (Allocator *)in_stack_fffffffffffffb90);
    bVar3 = Mat::empty(in_stack_fffffffffffffb90);
    if (bVar3) {
      local_4 = -100;
      local_90 = 1;
    }
    else {
      Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                in_stack_fffffffffffffb9c);
      local_174 = *(float *)(in_RDI + 0x88) / (float)*(int *)(in_RDI + 0x84);
      for (local_178 = 0; local_178 < local_2c; local_178 = local_178 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_1c0);
        Mat::~Mat((Mat *)0x1499e9);
        local_180 = pfVar4;
        for (local_1c4 = local_178 - *(int *)(in_RDI + 0x84) / 2;
            _c = (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
            local_1c4 <= local_178 + *(int *)(in_RDI + 0x84) / 2; local_1c4 = local_1c4 + 1) {
          if ((-1 < local_1c4) && (local_1c4 < local_2c)) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),_c);
            pfVar4 = Mat::operator_cast_to_float_(&local_210);
            Mat::~Mat((Mat *)0x149ae2);
            for (local_214 = 0; local_1d0 = pfVar4, local_214 < local_3c; local_214 = local_214 + 1)
            {
              local_180[local_214] = pfVar4[local_214] + local_180[local_214];
            }
          }
        }
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),_c);
        pfVar4 = Mat::operator_cast_to_float_(&local_260);
        Mat::~Mat((Mat *)0x149bc9);
        local_220 = pfVar4;
        for (local_264 = 0; local_264 < local_3c; local_264 = local_264 + 1) {
          fVar1 = local_220[local_264];
          dVar2 = std::pow((double)(ulong)(uint)(*(float *)(in_RDI + 0x90) +
                                                local_174 * local_180[local_264]),
                           (double)((ulong)*(uint *)(in_RDI + 0x8c) ^ 0x8000000080000000));
          local_220[local_264] = fVar1 * SUB84(dVar2,0);
        }
      }
      local_90 = 0;
    }
    Mat::~Mat((Mat *)0x149cec);
joined_r0x0014a343:
    if (local_90 != 0) goto LAB_0014a37d;
  }
  else if (*(int *)(in_RDI + 0x80) == 1) {
    local_268 = local_24;
    local_26c = local_28;
    Mat::Mat((Mat *)(local_2e8 + 0x38),&local_80);
    local_2e8._52_4_ = *(int *)(in_RDI + 0x84) / 2;
    if ((int)local_2e8._52_4_ < 1) {
LAB_00149e87:
      local_2ec = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x84);
      local_2f0 = *(float *)(in_RDI + 0x88) / (float)local_2ec;
      std::allocator<int>::allocator((allocator<int> *)0x149edc);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
                 in_stack_fffffffffffffba8,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::allocator<int>::~allocator((allocator<int> *)0x149f02);
      local_318 = std::vector<int,_std::allocator<int>_>::operator[](&local_308,0);
      local_31c = 0;
      local_320 = 0;
      local_324 = local_24 - *(int *)(in_RDI + 0x84);
      for (local_328 = 0; local_328 < *(int *)(in_RDI + 0x84); local_328 = local_328 + 1) {
        for (local_32c = 0; local_32c < *(int *)(in_RDI + 0x84); local_32c = local_32c + 1) {
          local_318[local_31c] = local_320;
          local_31c = local_31c + 1;
          local_320 = local_320 + 1;
        }
        local_320 = local_324 + local_320;
      }
      for (local_330 = 0; local_330 < local_2c; local_330 = local_330 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(&local_378);
        Mat::~Mat((Mat *)0x14a093);
        local_338 = pfVar4;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        for (local_3bc = 0; local_3bc < local_26c; local_3bc = local_3bc + 1) {
          for (local_3c0 = 0; local_3c0 < local_268; local_3c0 = local_3c0 + 1) {
            pfVar4 = Mat::row(&local_3b8,local_3bc);
            local_3cc = 0.0;
            for (local_3d0 = 0; local_3d0 < local_2ec; local_3d0 = local_3d0 + 1) {
              local_3cc = pfVar4[(long)local_3c0 + (long)local_318[local_3d0]] + local_3cc;
            }
            in_stack_fffffffffffffba0 = local_338[local_3c0];
            dVar2 = std::pow((double)(ulong)(uint)(*(float *)(in_RDI + 0x90) + local_2f0 * local_3cc
                                                  ),
                             (double)((ulong)*(uint *)(in_RDI + 0x8c) ^ 0x8000000080000000));
            in_stack_fffffffffffffba4 = SUB84(dVar2,0);
            local_338[local_3c0] = in_stack_fffffffffffffba0 * in_stack_fffffffffffffba4;
          }
          local_338 = local_338 + local_268;
        }
        Mat::~Mat((Mat *)0x14a2ff);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      local_90 = 0;
    }
    else {
      local_2e8._32_8_ = local_20[4];
      local_2e8._0_8_ = *local_20;
      local_2e8._16_4_ = *(undefined4 *)(local_20 + 2);
      local_2e8._20_4_ = *(undefined4 *)((long)local_20 + 0x14);
      local_2e8._24_4_ = *(undefined4 *)(local_20 + 3);
      local_2e8._28_4_ = *(undefined4 *)((long)local_20 + 0x1c);
      local_2e8._8_8_ = local_20[2];
      in_stack_fffffffffffffb90 = (Mat *)local_2e8;
      copy_make_border(in_stack_000004d0,in_stack_000004c8,in_stack_000004c4,in_stack_000004c0,
                       in_stack_000004bc,in_stack_000004b8,in_stack_000004e0,in_stack_000004b4,
                       in_stack_000004e8);
      bVar3 = Mat::empty(in_stack_fffffffffffffb90);
      if (!bVar3) {
        local_24 = local_284;
        local_28 = local_280;
        goto LAB_00149e87;
      }
      local_4 = -100;
      local_90 = 1;
    }
    Mat::~Mat((Mat *)0x14a33a);
    goto joined_r0x0014a343;
  }
  local_4 = 0;
  local_90 = 1;
LAB_0014a37d:
  Mat::~Mat((Mat *)0x14a38a);
  return local_4;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}